

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall MemoryBufferTest_Grow_Test::TestBody(MemoryBufferTest_Grow_Test *this)

{
  MockSpec<int_*(unsigned_long)> *this_00;
  TypedExpectation<int_*(unsigned_long)> *this_01;
  MockSpec<void_(int_*,_unsigned_long)> *this_02;
  int i;
  long lVar1;
  int i_1;
  char *pcVar2;
  long lVar3;
  AssertHelper local_1f0;
  AssertionResult gtest_ar_1;
  MatcherBase<unsigned_long> local_1d0;
  TestMemoryBuffer buffer;
  int mem [20];
  mock_allocator<int> alloc;
  
  mock_allocator<int>::mock_allocator(&alloc);
  buffer.super_Base.super_basic_buffer<int>.ptr_ = buffer.super_Base.store_;
  buffer.super_Base.super_basic_buffer<int>.size_ = 0;
  buffer.super_Base.super_basic_buffer<int>.capacity_ = 10;
  buffer.super_Base.super_basic_buffer<int>._vptr_basic_buffer = (_func_int **)&PTR_grow_00261f50;
  buffer.super_Base.super_allocator_ref<mock_allocator<int>_>.alloc_ = &alloc;
  fmt::v5::internal::basic_buffer<int>::resize((basic_buffer<int> *)&buffer,7);
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    buffer.super_Base.super_basic_buffer<int>.ptr_[lVar1] = (int)lVar1 * (int)lVar1;
  }
  local_1d0._vptr_MatcherBase = (_func_int **)CONCAT44(local_1d0._vptr_MatcherBase._4_4_,10);
  gtest_ar_1._0_8_ = buffer.super_Base.super_basic_buffer<int>.capacity_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)mem,"10u","buffer.capacity()",(uint *)&local_1d0,
             (unsigned_long *)&gtest_ar_1);
  if ((char)mem[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (mem._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)mem._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(mem + 2));
  mem[7] = 0xdead;
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&gtest_ar_1,0x14);
  this_00 = mock_allocator<int>::gmock_allocate(&alloc,(Matcher<unsigned_long> *)&gtest_ar_1);
  this_01 = testing::internal::MockSpec<int_*(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                       ,0x16f,"alloc","allocate(20)");
  local_1f0.data_ = (AssertHelperData *)mem;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1d0);
  testing::internal::TypedExpectation<int_*(unsigned_long)>::WillOnce
            (this_01,(Action<int_*(unsigned_long)> *)&local_1d0);
  testing::internal::linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_> *)&local_1d0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_ar_1);
  fmt::v5::basic_memory_buffer<int,_10UL,_allocator_ref<mock_allocator<int>_>_>::grow
            (&buffer.super_Base,0x14);
  local_1f0.data_._0_4_ = 0x14;
  local_1d0._vptr_MatcherBase = (_func_int **)buffer.super_Base.super_basic_buffer<int>.capacity_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_1,"20u","buffer.capacity()",(uint *)&local_1f0,
             (unsigned_long *)&local_1d0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  lVar3 = 0;
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    local_1d0._vptr_MatcherBase =
         (_func_int **)CONCAT44(local_1d0._vptr_MatcherBase._4_4_,(int)lVar1 * (int)lVar1);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"i * i","buffer[to_unsigned(i)]",(int *)&local_1d0,
               (int *)((long)buffer.super_Base.super_basic_buffer<int>.ptr_ + lVar3));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_1d0);
      pcVar2 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                 ,0x174,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1d0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    lVar3 = lVar3 + 4;
  }
  local_1d0._vptr_MatcherBase = (_func_int **)CONCAT44(local_1d0._vptr_MatcherBase._4_4_,0xdead);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"0xdead","buffer[7]",(int *)&local_1d0,
             buffer.super_Base.super_basic_buffer<int>.ptr_ + 7);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  testing::Matcher<int_*>::Matcher((Matcher<int_*> *)&gtest_ar_1,mem);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_1d0,0x14);
  this_02 = mock_allocator<int>::gmock_deallocate
                      (&alloc,(Matcher<int_*> *)&gtest_ar_1,(Matcher<unsigned_long> *)&local_1d0);
  testing::internal::MockSpec<void_(int_*,_unsigned_long)>::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x177,"alloc","deallocate(mem, 20)");
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_1d0);
  testing::internal::MatcherBase<int_*>::~MatcherBase((MatcherBase<int_*> *)&gtest_ar_1);
  fmt::v5::basic_memory_buffer<int,_10UL,_allocator_ref<mock_allocator<int>_>_>::
  ~basic_memory_buffer(&buffer.super_Base);
  mock_allocator<int>::~mock_allocator(&alloc);
  return;
}

Assistant:

TEST(MemoryBufferTest, Grow) {
  typedef allocator_ref< mock_allocator<int> > Allocator;
  typedef basic_memory_buffer<int, 10, Allocator> Base;
  mock_allocator<int> alloc;
  struct TestMemoryBuffer : Base {
    TestMemoryBuffer(Allocator alloc) : Base(alloc) {}
    void grow(std::size_t size) { Base::grow(size); }
  } buffer((Allocator(&alloc)));
  buffer.resize(7);
  using fmt::internal::to_unsigned;
  for (int i = 0; i < 7; ++i)
    buffer[to_unsigned(i)] = i * i;
  EXPECT_EQ(10u, buffer.capacity());
  int mem[20];
  mem[7] = 0xdead;
  EXPECT_CALL(alloc, allocate(20)).WillOnce(Return(mem));
  buffer.grow(20);
  EXPECT_EQ(20u, buffer.capacity());
  // Check if size elements have been copied
  for (int i = 0; i < 7; ++i)
    EXPECT_EQ(i * i, buffer[to_unsigned(i)]);
  // and no more than that.
  EXPECT_EQ(0xdead, buffer[7]);
  EXPECT_CALL(alloc, deallocate(mem, 20));
}